

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# em.cpp
# Opt level: O2

void __thiscall merlin::em::m_step(em *this)

{
  double dVar1;
  pointer pfVar2;
  ostream *poVar3;
  _func_int **pp_Var4;
  size_t i_00;
  reference pvVar5;
  ulong uVar6;
  factor *f;
  ulong uVar7;
  size_t i;
  long lVar8;
  value vVar9;
  vector<merlin::factor,_std::allocator<merlin::factor>_> new_thetas;
  vector<merlin::factor,_std::allocator<merlin::factor>_> local_3a0;
  index_config cv1;
  variable_set scope;
  variable_set vx;
  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  config;
  factor new_th;
  factor temp;
  config_index cv2;
  factor sum;
  
  if (this->m_debug == true) {
    poVar3 = std::operator<<((ostream *)&std::cout,"[DEBUG] Begin M-step");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  std::vector<merlin::factor,_std::allocator<merlin::factor>_>::vector
            (&new_thetas,
             ((long)(this->m_gmo).m_factors.
                    super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(this->m_gmo).m_factors.
                   super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
                   super__Vector_impl_data._M_start) / 0x60,(allocator_type *)&sum);
  uVar7 = 0;
  while( true ) {
    pfVar2 = (this->m_gmo).m_factors.
             super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->m_gmo).m_factors.
                       super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pfVar2) / 0x60) <= uVar7) {
      std::vector<merlin::factor,_std::allocator<merlin::factor>_>::vector(&local_3a0,&new_thetas);
      graphical_model::graphical_model((graphical_model *)&sum,&local_3a0);
      graphical_model::operator=(&this->m_gmo,(graphical_model *)&sum);
      graphical_model::~graphical_model((graphical_model *)&sum);
      std::vector<merlin::factor,_std::allocator<merlin::factor>_>::~vector(&local_3a0);
      cte::reinit(&this->m_infer,&(this->m_gmo).m_factors);
      if (this->m_debug == true) {
        poVar3 = std::operator<<((ostream *)&std::cout,"[DEBUG] End M-step");
        std::endl<char,std::char_traits<char>>(poVar3);
        poVar3 = std::operator<<((ostream *)&std::cout,"[DEBUG] Updated parameters:");
        std::endl<char,std::char_traits<char>>(poVar3);
        lVar8 = 0;
        for (uVar7 = 0;
            uVar7 < (ulong)(((long)new_thetas.
                                   super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)new_thetas.
                                  super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>
                                  ._M_impl.super__Vector_impl_data._M_start) / 0x60);
            uVar7 = uVar7 + 1) {
          poVar3 = std::operator<<((ostream *)&std::cout,"[DEBUG]  ");
          poVar3 = operator<<(poVar3,(factor *)
                                     ((long)&(new_thetas.
                                              super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                             _vptr_factor + lVar8));
          std::endl<char,std::char_traits<char>>(poVar3);
          lVar8 = lVar8 + 0x60;
        }
      }
      std::vector<merlin::factor,_std::allocator<merlin::factor>_>::~vector(&new_thetas);
      return;
    }
    pp_Var4 = (_func_int **)(long)pfVar2[uVar7].c_;
    if ((long)pp_Var4 < 0) break;
    dVar1 = (this->m_gmo).m_dims.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[(long)pp_Var4];
    uVar6 = (ulong)dVar1;
    sum.v_.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((long)(dVar1 - 9.223372036854776e+18) & (long)uVar6 >> 0x3f | uVar6);
    sum._vptr_factor = pp_Var4;
    variable_set::variable_set(&vx,(variable *)&sum);
    factor::sum(&sum,(this->m_counts).
                     super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar7,&vx);
    factor::binaryOp<merlin::factor::binOpDivide>
              (&temp,(this->m_counts).
                     super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar7,&sum);
    f = pfVar2 + uVar7;
    variable_set::variable_set(&scope,&f->v_);
    factor::factor(&new_th,f);
    index_config::index_config(&cv1,&scope,true);
    config_index::config_index(&cv2,&sum.v_,true);
    for (uVar6 = 0;
        uVar6 < (ulong)((long)(f->t_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)(f->t_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start >> 3); uVar6 = uVar6 + 1) {
      index_config::convert
                ((map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                  *)&config._M_t,&cv1,uVar6);
      i_00 = config_index::convert
                       (&cv2,(map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                              *)&config._M_t);
      vVar9 = factor::get(&sum,i_00);
      if ((vVar9 != 0.0) || (NAN(vVar9))) {
        vVar9 = factor::get(&temp,uVar6);
        pvVar5 = std::vector<double,_std::allocator<double>_>::at(&new_th.t_,uVar6);
        *pvVar5 = vVar9;
      }
      std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
      ::~_Rb_tree(&config._M_t);
    }
    factor::operator=(new_thetas.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar7,&new_th);
    config_index::~config_index(&cv2);
    index_config::~index_config(&cv1);
    factor::~factor(&new_th);
    variable_set::~variable_set(&scope);
    factor::~factor(&temp);
    factor::~factor(&sum);
    variable_set::~variable_set(&vx);
    uVar7 = uVar7 + 1;
  }
  __assert_fail("x >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/radum2275[P]merlin/src/em.cpp",
                0x8f,"void merlin::em::m_step()");
}

Assistant:

void em::m_step() {

	if (m_debug) {
		std::cout << "[DEBUG] Begin M-step" << std::endl;
	}

	// Update the new parameters by dividing the corresponding counts
	const std::vector<factor>& thetas = m_gmo.get_factors();
	std::vector<factor> new_thetas(thetas.size());

	// counts factors must be aligned to the theta factors (by construction)
	for (size_t i = 0; i < thetas.size(); ++i) {
		const factor& th = thetas[i];
		int x = th.get_child();
		assert(x >= 0);

		variable_set vx(m_gmo.var(x));
		factor sum = m_counts[i].sum(vx);
		factor temp = m_counts[i] / sum;
		variable_set scope = th.vars();
		factor new_th = th; // copy the previous factor
		index_config cv1(scope, true);
		config_index cv2(sum.vars(), true);
		for (size_t j = 0; j < th.num_states(); ++j) {
			std::map<size_t, size_t> config = cv1.convert(j);
			size_t k = cv2.convert(config);
			if (sum.get(k) != 0) {
				double v = temp.get(j);
				new_th.set(j, v);
			}
		}

		new_thetas[i] = new_th;
	}

	// Set the new parameters (discard the old ones)
	m_gmo = graphical_model(new_thetas);
	m_infer.reinit(m_gmo.get_factors());
//	m_infer = cte(m_gmo);
//	m_infer.set_properties(m_properties);
//	m_infer.init(); // re-initialize the join tree

	if (m_debug) {
		std::cout << "[DEBUG] End M-step" << std::endl;
		std::cout << "[DEBUG] Updated parameters:" << std::endl;
		for (size_t i = 0; i < new_thetas.size(); ++i) {
			std::cout << "[DEBUG]  " << new_thetas[i] << std::endl;
		}
	}
}